

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O3

int mbedtls_ctr_drbg_reseed(mbedtls_ctr_drbg_context *ctx,uchar *additional,size_t len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uchar seed [384];
  uchar auStack_1a8 [384];
  
  sVar3 = ctx->entropy_len;
  iVar2 = -0x38;
  if (sVar3 + len < 0x181) {
    memset(auStack_1a8,0,0x180);
    iVar1 = (*ctx->f_entropy)(ctx->p_entropy,auStack_1a8,sVar3);
    iVar2 = -0x34;
    if (iVar1 == 0) {
      sVar3 = ctx->entropy_len;
      if (len != 0 && additional != (uchar *)0x0) {
        memcpy(auStack_1a8 + sVar3,additional,len);
        sVar3 = sVar3 + len;
      }
      block_cipher_df(auStack_1a8,auStack_1a8,sVar3);
      ctr_drbg_update_internal(ctx,auStack_1a8);
      ctx->reseed_counter = 1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ctr_drbg_reseed( mbedtls_ctr_drbg_context *ctx,
                     const unsigned char *additional, size_t len )
{
    unsigned char seed[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT];
    size_t seedlen = 0;

    if( ctx->entropy_len + len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( seed, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT );

    /*
     * Gather entropy_len bytes of entropy to seed state
     */
    if( 0 != ctx->f_entropy( ctx->p_entropy, seed,
                             ctx->entropy_len ) )
    {
        return( MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED );
    }

    seedlen += ctx->entropy_len;

    /*
     * Add additional data
     */
    if( additional && len )
    {
        memcpy( seed + seedlen, additional, len );
        seedlen += len;
    }

    /*
     * Reduce to 384 bits
     */
    block_cipher_df( seed, seed, seedlen );

    /*
     * Update state
     */
    ctr_drbg_update_internal( ctx, seed );
    ctx->reseed_counter = 1;

    return( 0 );
}